

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Generators::Generators<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>::
populate(Generators<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_> *this,
        pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *val)

{
  pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *in_stack_00000008;
  GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
  *in_stack_ffffffffffffffd8;
  vector<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::allocator<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  value<pair<trng::portable_impl::uint128,trng::portable_impl::uint128>>(in_stack_00000008);
  std::
  vector<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,trng::portable_impl::uint128>>,std::allocator<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,trng::portable_impl::uint128>>>>
  ::
  emplace_back<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,trng::portable_impl::uint128>>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>::
  ~GeneratorWrapper((GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
                     *)0x44a339);
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }